

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-profile-table.cc
# Opt level: O0

void __thiscall HeapProfileTable::MarkAsIgnored(HeapProfileTable *this,void *ptr)

{
  AllocValue *this_00;
  AllocValue *alloc;
  void *ptr_local;
  HeapProfileTable *this_local;
  
  this_00 = AddressMap<HeapProfileTable::AllocValue>::FindMutable(this->address_map_,ptr);
  if (this_00 != (AllocValue *)0x0) {
    AllocValue::set_ignore(this_00,true);
  }
  return;
}

Assistant:

void HeapProfileTable::MarkAsIgnored(const void* ptr) {
  AllocValue* alloc = address_map_->FindMutable(ptr);
  if (alloc) {
    alloc->set_ignore(true);
  }
}